

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
FSDist_COF::SampleState
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FSDist_COF *this)

{
  ulong uVar1;
  pointer puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  allocator_type local_19;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,this->_m_nrStateFactors,&local_19);
  if (this->_m_nrStateFactors != 0) {
    uVar5 = 0;
    do {
      iVar3 = rand();
      uVar1 = (this->_m_sfacDomainSizes).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      if (uVar1 != 0) {
        dVar6 = 0.0;
        uVar4 = 0;
        do {
          dVar6 = dVar6 + *(double *)
                           (*(long *)&(this->_m_probs).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + uVar4 * 8);
          if ((double)iVar3 * 4.656612873077393e-10 <= dVar6) {
            puVar2 = (__return_storage_ptr__->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <=
                uVar5) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar5);
            }
            puVar2[uVar5] = (uint)uVar4;
            break;
          }
          uVar4 = (ulong)((uint)uVar4 + 1);
        } while (uVar4 < uVar1);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < this->_m_nrStateFactors);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Index> FSDist_COF::SampleState() const
{
    vector<Index> state(_m_nrStateFactors);

    for(Index i=0; i < _m_nrStateFactors; i++)    
    {  
        double randNr=rand() / (RAND_MAX + 1.0);
        double sum=0;
        for(Index valI = 0; valI < _m_sfacDomainSizes[i]; valI++)
        {
            sum+=_m_probs[i][valI];
            if(randNr<=sum)
            {
                state.at(i)=valI;
                break;
            }
        }
    }
    return state;
}